

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_test.cc
# Opt level: O2

Loss * xLearn::CreateLoss(char *format_name)

{
  ObjectCreatorRegistry_xLearn_loss_registry *this;
  Loss *pLVar1;
  allocator local_39;
  string local_38;
  
  this = GetRegistry_xLearn_loss_registry();
  std::__cxx11::string::string((string *)&local_38,format_name,&local_39);
  pLVar1 = ObjectCreatorRegistry_xLearn_loss_registry::CreateObject(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return pLVar1;
}

Assistant:

Loss* CreateLoss(const char* format_name) {
  return CREATE_LOSS(format_name);
}